

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource::IfcConstructionMaterialResource
          (IfcConstructionMaterialResource *this)

{
  *(undefined ***)&this->field_0x1b8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1c0 = 0;
  *(char **)&this->field_0x1c8 = "IfcConstructionMaterialResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__007f5010);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x7f4f08;
  *(undefined8 *)&this->field_0x1b8 = 0x7f4ff8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x7f4f30;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x7f4f58;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x7f4f80;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x7f4fa8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x7f4fd0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x188 = 0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(undefined8 *)&this->field_0x191 = 0;
  *(undefined8 *)&this->field_0x199 = 0;
  (this->UsageRatio).have = false;
  return;
}

Assistant:

IfcConstructionMaterialResource() : Object("IfcConstructionMaterialResource") {}